

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Matcher::HardFail
          (Matcher *this,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,HardFailMode mode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint8 **instPointer_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *this_local;
  
  switch(mode) {
  case BacktrackAndLater:
    this_local._7_1_ = Fail(this,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    break;
  case BacktrackOnly:
    bVar2 = Fail(this,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    if (bVar2) {
      *matchStart = inputLength;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case LaterOnly:
    if (this->w != (Type)0x0) {
      DebugWriter::PrintEOL(this->w,L"CLEAR");
    }
    ContinuousPageStack<1UL>::Clear((ContinuousPageStack<1UL> *)contStack);
    ContinuousPageStack<1UL>::Clear((ContinuousPageStack<1UL> *)assertionStack);
    this_local._7_1_ = true;
    break;
  case ImmediateFail:
    *matchStart = inputLength;
    this_local._7_1_ = true;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xc5,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Matcher::HardFail(
        const Char* const input
        , const CharCount inputLength
        , CharCount &matchStart
        , CharCount &inputOffset
        , const uint8 *&instPointer
        , ContStack &contStack
        , AssertionStack &assertionStack
        , uint &qcTicks
        , HardFailMode mode)
    {
        switch (mode)
        {
        case HardFailMode::BacktrackAndLater:
            return Fail(FAIL_PARAMETERS);
        case HardFailMode::BacktrackOnly:
            if (Fail(FAIL_PARAMETERS))
            {
                // No use trying any more start positions
                matchStart = inputLength;
                return true; // STOP EXECUTING
            }
            else
            {
                return false;
            }
        case HardFailMode::LaterOnly:
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (w != 0)
            {
                w->PrintEOL(_u("CLEAR"));
            }
#endif
            contStack.Clear();
            assertionStack.Clear();
            return true; // STOP EXECUTING
        case HardFailMode::ImmediateFail:
            // No use trying any more start positions
            matchStart = inputLength;
            return true; // STOP EXECUTING
        default:
            Assume(false);
        }

        return true;
    }